

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::fixBlockUniformLayoutPacking
          (TParseContext *this,TQualifier *qualifier,TTypeList *originTypeList,
          TTypeList *tmpTypeList)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  size_type sVar4;
  reference pvVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TTypeList *pTVar6;
  TTypeList *tmpTypeList_00;
  byte bVar7;
  int __flags;
  void *__child_stack;
  __fn *__fn;
  void *in_R8;
  bool bVar8;
  TType *local_70;
  TTypeList *structure;
  TType *tmpType;
  uint member;
  TTypeList *tmpTypeList_local;
  TTypeList *originTypeList_local;
  TQualifier *qualifier_local;
  TParseContext *this_local;
  
  bVar8 = true;
  if (tmpTypeList != (TTypeList *)0x0) {
    sVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&originTypeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    sVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                      (&tmpTypeList->
                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      );
    bVar8 = sVar3 == sVar4;
  }
  if (!bVar8) {
    __assert_fail("tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                  ,0x26b9,
                  "void glslang::TParseContext::fixBlockUniformLayoutPacking(TQualifier &, TTypeList *, TTypeList *)"
                 );
  }
  for (tmpType._4_4_ = 0;
      sVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (&originTypeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ), tmpType._4_4_ < sVar3; tmpType._4_4_ = tmpType._4_4_ + 1) {
    if ((qualifier->field_0x10 & 0xf) != 0) {
      if (tmpTypeList == (TTypeList *)0x0) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)tmpType._4_4_);
        iVar1 = (*pvVar5->type->_vptr_TType[10])();
        if ((*(byte *)(CONCAT44(extraout_var,iVar1) + 0x10) & 0xf) == 0) {
          pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&originTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)tmpType._4_4_);
          uVar2 = (*pvVar5->type->_vptr_TType[0x1a])();
          if ((uVar2 & 1) == 0) {
            bVar7 = qualifier->field_0x10;
            pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     operator[](&originTypeList->
                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ,(ulong)tmpType._4_4_);
            iVar1 = (*pvVar5->type->_vptr_TType[10])();
            bVar7 = *(byte *)(CONCAT44(extraout_var_00,iVar1) + 0x10) & 0xf0 | bVar7 & 0xf;
            sVar3 = (size_type)bVar7;
            *(byte *)(CONCAT44(extraout_var_00,iVar1) + 0x10) = bVar7;
          }
        }
      }
      else {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)tmpType._4_4_);
        iVar1 = (*pvVar5->type->_vptr_TType[10])();
        if ((*(byte *)(CONCAT44(extraout_var_01,iVar1) + 0x10) & 0xf) == 0) {
          pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   operator[](&tmpTypeList->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ,(ulong)tmpType._4_4_);
          uVar2 = (*pvVar5->type->_vptr_TType[0x1a])();
          if ((uVar2 & 1) == 0) {
            bVar7 = qualifier->field_0x10;
            pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                     operator[](&tmpTypeList->
                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ,(ulong)tmpType._4_4_);
            iVar1 = (*pvVar5->type->_vptr_TType[10])();
            bVar7 = *(byte *)(CONCAT44(extraout_var_02,iVar1) + 0x10) & 0xf0 | bVar7 & 0xf;
            sVar3 = (size_type)bVar7;
            *(byte *)(CONCAT44(extraout_var_02,iVar1) + 0x10) = bVar7;
          }
        }
      }
    }
    __flags = (int)sVar3;
    pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (&originTypeList->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                        ,(ulong)tmpType._4_4_);
    iVar1 = (*pvVar5->type->_vptr_TType[7])();
    if (iVar1 == 0xf) {
      if (tmpTypeList == (TTypeList *)0x0) {
        __fn = (__fn *)(ulong)tmpType._4_4_;
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(size_type)__fn);
        iVar1 = TType::clone(pvVar5->type,__fn,__child_stack,__flags,in_R8);
        local_70 = (TType *)CONCAT44(extraout_var_03,iVar1);
      }
      else {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)tmpType._4_4_);
        local_70 = pvVar5->type;
      }
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&originTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)tmpType._4_4_);
      pTVar6 = TType::getWritableStruct(pvVar5->type);
      tmpTypeList_00 = TType::getWritableStruct(local_70);
      fixBlockUniformLayoutPacking(this,qualifier,pTVar6,tmpTypeList_00);
      pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](&originTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ,(ulong)tmpType._4_4_);
      pTVar6 = recordStructCopy(this,&this->packingFixRecord,pvVar5->type,local_70);
      if (tmpTypeList == (TTypeList *)0x0) {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&originTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)tmpType._4_4_);
        TType::setStruct(pvVar5->type,pTVar6);
      }
      else {
        pvVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                 operator[](&tmpTypeList->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                            ,(ulong)tmpType._4_4_);
        TType::setStruct(pvVar5->type,pTVar6);
      }
    }
  }
  return;
}

Assistant:

void TParseContext::fixBlockUniformLayoutPacking(TQualifier& qualifier, TTypeList* originTypeList,
                                                 TTypeList* tmpTypeList)
{
    assert(tmpTypeList == nullptr || originTypeList->size() == tmpTypeList->size());
    for (unsigned int member = 0; member < originTypeList->size(); ++member) {
        if (qualifier.layoutPacking != ElpNone) {
            if (tmpTypeList == nullptr) {
                if ((*originTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*originTypeList)[member].type->isScalarOrVector()) {
                    (*originTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            } else {
                if ((*tmpTypeList)[member].type->getQualifier().layoutPacking == ElpNone &&
                    !(*tmpTypeList)[member].type->isScalarOrVector()) {
                    (*tmpTypeList)[member].type->getQualifier().layoutPacking = qualifier.layoutPacking;
                }
            }
        }

        if ((*originTypeList)[member].type->getBasicType() == EbtStruct) {
            // Deep copy the type in pool.
            // Because, struct use in different block may have different layout qualifier.
            // We have to new a object to distinguish between them.
            const TType* tmpType = tmpTypeList == nullptr ?
                (*originTypeList)[member].type->clone() : (*tmpTypeList)[member].type;

            fixBlockUniformLayoutPacking(qualifier, (*originTypeList)[member].type->getWritableStruct(),
                                         tmpType->getWritableStruct());

            const TTypeList* structure = recordStructCopy(packingFixRecord, (*originTypeList)[member].type, tmpType);

            if (tmpTypeList == nullptr) {
                (*originTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
            if (tmpTypeList != nullptr) {
                (*tmpTypeList)[member].type->setStruct(const_cast<TTypeList*>(structure));
            }
        }
    }
}